

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simdjson.cpp
# Opt level: O3

bool __thiscall ParsedJson::iterator::move_forward(iterator *this)

{
  byte bVar1;
  size_t sVar2;
  ulong uVar3;
  scopeindex_t *psVar4;
  uint64_t *puVar5;
  uint64_t uVar6;
  bool bVar7;
  ulong uVar8;
  size_t sVar9;
  
  sVar2 = this->location;
  uVar3 = this->tape_length;
  if (uVar3 <= sVar2 + 1) {
    return false;
  }
  bVar1 = this->current_type;
  if ((bVar1 | 0x20) == 0x7b) {
    psVar4 = this->depthindex;
    sVar9 = this->depth + 1;
    this->depth = sVar9;
    psVar4[sVar9].start_of_scope = sVar2;
    psVar4[sVar9].scope_type = bVar1;
  }
  else {
    sVar9 = this->depth;
  }
  this->location = sVar2 + 1;
  puVar5 = this->pj->tape;
  uVar8 = sVar2 + 2;
  do {
    sVar9 = sVar9 - 1;
    uVar6 = puVar5[uVar8 - 1];
    this->current_val = uVar6;
    bVar1 = (byte)(uVar6 >> 0x38);
    if ((bVar1 | 0x20) != 0x7d) {
      bVar7 = true;
LAB_00107fcf:
      this->current_type = bVar1;
      return bVar7;
    }
    if ((uVar3 <= uVar8) || (this->depth = sVar9, sVar9 == 0)) {
      bVar7 = false;
      goto LAB_00107fcf;
    }
    this->location = uVar8;
    uVar8 = uVar8 + 1;
  } while( true );
}

Assistant:

bool ParsedJson::iterator::move_forward() {
    if(location + 1 >= tape_length) {
    return false; // we are at the end!
    }
    // we are entering a new scope
    if ((current_type == '[') || (current_type == '{')){
    depth++;
    depthindex[depth].start_of_scope = location;
    depthindex[depth].scope_type = current_type;
    }
    location = location + 1;
    current_val = pj.tape[location];
    current_type = (current_val >> 56);
    // if we encounter a scope closure, we need to move up
    while ((current_type == ']') || (current_type == '}')) {
    if(location + 1 >= tape_length) {
        return false; // we are at the end!
    }
    depth--;
    if(depth == 0) {
        return false; // should not be necessary
    }
    location = location + 1;
    current_val = pj.tape[location];
    current_type = (current_val >> 56);
    }
    return true;
}